

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_ref_t flatcc_builder_end_struct(flatcc_builder_t *B)

{
  flatcc_builder_ref_t fVar1;
  
  if (B->frame->type == 2) {
    fVar1 = flatcc_builder_create_struct(B,B->ds,(ulong)B->ds_offset,B->align);
    if (fVar1 != 0) {
      exit_frame(B);
    }
    return fVar1;
  }
  __assert_fail("(B->frame[0].type) == flatcc_builder_struct",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x37d,"flatcc_builder_ref_t flatcc_builder_end_struct(flatcc_builder_t *)");
}

Assistant:

flatcc_builder_ref_t flatcc_builder_end_struct(flatcc_builder_t *B)
{
    flatcc_builder_ref_t object_ref;

    check(frame(type) == flatcc_builder_struct, "expected struct frame");
    if (0 == (object_ref = flatcc_builder_create_struct(B, B->ds, B->ds_offset, B->align))) {
        return 0;
    }
    exit_frame(B);
    return object_ref;
}